

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O1

bool dxil_spv::emit_write_sampler_feedback_instruction(Op opcode,Impl *impl,CallInst *instruction)

{
  uint32_t uVar1;
  mapped_type *pmVar2;
  bool bVar3;
  Id IVar4;
  Id image_id;
  Id IVar5;
  Id IVar6;
  Id component;
  Id component_00;
  Id IVar7;
  Id IVar8;
  Id IVar9;
  Id IVar10;
  uint uVar11;
  ValueKind VVar12;
  int iVar13;
  Builder *this;
  Value *pVVar14;
  Operation *pOVar15;
  Operation *pOVar16;
  Builder *pBVar17;
  Value *this_00;
  Operation *pOVar18;
  Operation *pOVar19;
  Operation *this_01;
  bool bVar20;
  Impl *pIVar21;
  Id type_id;
  Id *pIVar22;
  uint i_2;
  uint32_t i;
  long lVar23;
  uint32_t num_coords_full;
  uint32_t num_coords;
  Id ddx [2];
  Id feedback_id;
  Id coord_ids [2];
  Id local_b0;
  uint32_t local_98;
  Op local_94;
  Id local_90;
  Id local_8c;
  Id local_88;
  uint32_t local_84;
  Operation *local_80;
  Impl *local_78;
  initializer_list<unsigned_int> local_70;
  Id local_5c;
  Id local_58;
  Id local_54;
  Id local_50;
  Id local_4c;
  Id local_48 [2];
  mapped_type *local_40;
  Id local_38 [2];
  
  this = Converter::Impl::builder(impl);
  local_70._M_array = (iterator)CONCAT44(local_70._M_array._4_4_,0x32);
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)&this->capabilities,(Capability *)&local_70);
  if (impl->glsl_std450_ext == 0) {
    IVar4 = spv::Builder::import(this,"GLSL.std.450");
    impl->glsl_std450_ext = IVar4;
  }
  pVVar14 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar4 = 0;
  local_4c = Converter::Impl::get_id_for_value(impl,pVVar14,0);
  pVVar14 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
  image_id = Converter::Impl::get_id_for_value(impl,pVVar14,0);
  pVVar14 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,3);
  IVar5 = Converter::Impl::get_id_for_value(impl,pVVar14,0);
  local_40 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&impl->handle_to_resource_meta,&local_4c);
  local_98 = 0;
  local_84 = 0;
  local_78 = impl;
  bVar3 = get_image_dimensions(impl,image_id,&local_98,&local_84);
  bVar20 = local_84 == 2 && bVar3;
  if (local_84 != 2 || !bVar3) {
    return bVar20;
  }
  IVar6 = spv::Builder::makeBoolType(this);
  component = spv::Builder::makeIntegerType(this,0x20,true);
  component_00 = spv::Builder::makeFloatType(this,0x20);
  local_88 = IVar6;
  local_54 = spv::Builder::makeVectorType(this,IVar6,2);
  local_8c = spv::Builder::makeVectorType(this,component,2);
  local_90 = spv::Builder::makeVectorType(this,component_00,2);
  pIVar21 = local_78;
  uVar1 = local_98;
  if (local_98 == 3) {
    pOVar15 = Converter::Impl::allocate(local_78,OpExtInst,component_00);
    Operation::add_id(pOVar15,pIVar21->glsl_std450_ext);
    Operation::add_literal(pOVar15,2);
    pVVar14 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,6);
    IVar4 = Converter::Impl::get_id_for_value(pIVar21,pVVar14,0);
    Operation::add_id(pOVar15,IVar4);
    Converter::Impl::add(pIVar21,pOVar15,false);
    pOVar16 = Converter::Impl::allocate(pIVar21,OpConvertFToS,component);
    Operation::add_id(pOVar16,pOVar15->id);
    Converter::Impl::add(pIVar21,pOVar16,false);
    IVar4 = pOVar16->id;
  }
  lVar23 = 0;
  local_50 = IVar4;
  do {
    pVVar14 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(uint)lVar23 | 4);
    IVar4 = Converter::Impl::get_id_for_value(pIVar21,pVVar14,0);
    local_38[lVar23] = IVar4;
    lVar23 = lVar23 + 1;
  } while (lVar23 == 1);
  IVar7 = Converter::Impl::build_vector(pIVar21,component_00,local_38,2);
  IVar6 = local_4c;
  pBVar17 = Converter::Impl::builder(pIVar21);
  IVar8 = spv::Builder::makeIntegerType(pBVar17,0x20,true);
  IVar9 = spv::Builder::makeVectorType(pBVar17,IVar8,2);
  IVar4 = local_90;
  if (uVar1 == 3) {
    IVar10 = spv::Builder::makeVectorType(pBVar17,IVar8,3);
    pOVar16 = Converter::Impl::allocate(pIVar21,OpImageQuerySize,IVar10);
    Operation::add_id(pOVar16,IVar6);
    Converter::Impl::add(pIVar21,pOVar16,false);
    pOVar15 = Converter::Impl::allocate(pIVar21,OpVectorShuffle,IVar9);
    Operation::add_id(pOVar15,pOVar16->id);
    Operation::add_id(pOVar15,pOVar16->id);
    Operation::add_literal(pOVar15,0);
    Operation::add_literal(pOVar15,1);
  }
  else {
    pOVar15 = Converter::Impl::allocate(pIVar21,OpImageQuerySize,IVar9);
    Operation::add_id(pOVar15,IVar6);
  }
  local_b0 = 0;
  Converter::Impl::add(pIVar21,pOVar15,false);
  IVar6 = pOVar15->id;
  pOVar15 = Converter::Impl::allocate(pIVar21,OpBitwiseAnd,IVar9);
  Operation::add_id(pOVar15,IVar6);
  IVar6 = spv::Builder::makeIntegerType(pBVar17,0x20,true);
  IVar6 = spv::Builder::makeIntConstant(pBVar17,IVar6,0xf,false);
  IVar6 = Converter::Impl::build_splat_constant_vector(pIVar21,IVar8,IVar6,2);
  Operation::add_id(pOVar15,IVar6);
  Converter::Impl::add(pIVar21,pOVar15,false);
  local_58 = pOVar15->id;
  pBVar17 = Converter::Impl::builder(pIVar21);
  IVar6 = spv::Builder::makeIntegerType(pBVar17,0x20,true);
  pOVar15 = Converter::Impl::allocate(pIVar21,OpImageQueryLevels,IVar6);
  Operation::add_id(pOVar15,image_id);
  Converter::Impl::add(pIVar21,pOVar15,false);
  pOVar16 = Converter::Impl::allocate(pIVar21,OpISub,IVar6);
  Operation::add_id(pOVar16,pOVar15->id);
  IVar6 = spv::Builder::makeIntegerType(pBVar17,0x20,true);
  IVar6 = spv::Builder::makeIntConstant(pBVar17,IVar6,1,false);
  Operation::add_id(pOVar16,IVar6);
  Converter::Impl::add(pIVar21,pOVar16,false);
  local_80 = (Operation *)CONCAT44(local_80._4_4_,pOVar16->id);
  pBVar17 = Converter::Impl::builder(pIVar21);
  IVar6 = spv::Builder::makeFloatType(pBVar17,0x20);
  IVar8 = spv::Builder::makeVectorType(pBVar17,IVar6,2);
  local_94 = opcode & ~TempRegStore;
  if (local_94 == WriteSamplerFeedback) {
    local_b0 = 0;
    IVar9 = Converter::Impl::build_sampled_image(pIVar21,image_id,IVar5,false);
    IVar5 = IVar7;
    if (opcode == WriteSamplerFeedbackBias) {
      pOVar15 = Converter::Impl::allocate(pIVar21,OpExtInst,IVar6);
      Operation::add_id(pOVar15,pIVar21->glsl_std450_ext);
      Operation::add_literal(pOVar15,0x1d);
      pVVar14 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,8);
      IVar5 = Converter::Impl::get_id_for_value(pIVar21,pVVar14,0);
      Operation::add_id(pOVar15,IVar5);
      Converter::Impl::add(pIVar21,pOVar15,false);
      local_b0 = pOVar15->id;
      pOVar16 = Converter::Impl::allocate(pIVar21,OpGroupNonUniformQuadBroadcast,IVar6);
      IVar5 = spv::Builder::makeIntegerType(pBVar17,0x20,false);
      IVar5 = spv::Builder::makeIntConstant(pBVar17,IVar5,3,false);
      Operation::add_id(pOVar16,IVar5);
      Operation::add_id(pOVar16,pOVar15->id);
      IVar5 = spv::Builder::makeIntegerType(pBVar17,0x20,false);
      IVar5 = spv::Builder::makeIntConstant(pBVar17,IVar5,0,false);
      Operation::add_id(pOVar16,IVar5);
      Converter::Impl::add(pIVar21,pOVar16,false);
      local_70._M_array = (iterator)CONCAT44(local_70._M_array._4_4_,0x44);
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&pBVar17->capabilities,(Capability *)&local_70);
      pOVar15 = Converter::Impl::allocate(pIVar21,OpVectorTimesScalar,IVar8);
      Operation::add_id(pOVar15,IVar7);
      Operation::add_id(pOVar15,pOVar16->id);
      Converter::Impl::add(pIVar21,pOVar15,false);
      IVar5 = pOVar15->id;
    }
    IVar8 = spv::Builder::makeVectorType(pBVar17,IVar6,2);
    pOVar15 = Converter::Impl::allocate(pIVar21,OpImageQueryLod,IVar8);
    local_70._M_array = local_48;
    local_70._M_len = 2;
    local_48[0] = IVar9;
    local_48[1] = IVar5;
    Operation::add_ids(pOVar15,&local_70);
    Converter::Impl::add(pIVar21,pOVar15,false);
    pOVar16 = Converter::Impl::allocate(pIVar21,OpCompositeExtract,IVar6);
    Operation::add_id(pOVar16,pOVar15->id);
    Operation::add_literal(pOVar16,0);
    Converter::Impl::add(pIVar21,pOVar16,false);
    IVar5 = pOVar16->id;
  }
  else if (opcode == WriteSamplerFeedbackGrad) {
    pOVar15 = Converter::Impl::allocate(pIVar21,OpConvertSToF,IVar8);
    IVar5 = spv::Builder::makeIntegerType(pBVar17,0x20,true);
    lVar23 = 0;
    IVar5 = spv::Builder::makeIntConstant(pBVar17,IVar5,0,false);
    IVar5 = emit_query_size(pIVar21,image_id,uVar1 == 3,IVar5);
    Operation::add_id(pOVar15,IVar5);
    Converter::Impl::add(pIVar21,pOVar15,false);
    do {
      pVVar14 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(uint)lVar23 | 8);
      IVar5 = Converter::Impl::get_id_for_value(pIVar21,pVVar14,0);
      *(Id *)((long)&local_70._M_array + lVar23 * 4) = IVar5;
      pVVar14 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(uint)lVar23 + 0xb);
      IVar5 = Converter::Impl::get_id_for_value(pIVar21,pVVar14,0);
      local_48[lVar23] = IVar5;
      lVar23 = lVar23 + 1;
    } while (lVar23 == 1);
    IVar5 = Converter::Impl::build_vector(pIVar21,IVar6,(Id *)&local_70,2);
    IVar9 = Converter::Impl::build_vector(pIVar21,IVar6,local_48,2);
    pOVar16 = Converter::Impl::allocate(pIVar21,OpFMul,IVar8);
    Operation::add_id(pOVar16,pOVar15->id);
    Operation::add_id(pOVar16,IVar5);
    local_b0 = 0;
    Converter::Impl::add(pIVar21,pOVar16,false);
    pOVar18 = Converter::Impl::allocate(pIVar21,OpFMul,IVar8);
    Operation::add_id(pOVar18,pOVar15->id);
    Operation::add_id(pOVar18,IVar9);
    Converter::Impl::add(pIVar21,pOVar18,false);
    IVar5 = build_lod_from_gradient(pIVar21,pOVar16->id,pOVar18->id);
  }
  else {
    IVar5 = 0;
    if (opcode != WriteSamplerFeedbackLevel) goto LAB_00173f10;
    pVVar14 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,8);
    local_b0 = 0;
    IVar5 = Converter::Impl::get_id_for_value(pIVar21,pVVar14,0);
  }
  if (local_94 == WriteSamplerFeedbackLevel) {
    pOVar15 = Converter::Impl::allocate(pIVar21,OpConvertSToF,IVar6);
    Operation::add_id(pOVar15,(Id)local_80);
    Converter::Impl::add(pIVar21,pOVar15,false);
    pOVar16 = Converter::Impl::allocate(pIVar21,OpExtInst,IVar6);
    Operation::add_id(pOVar16,pIVar21->glsl_std450_ext);
    Operation::add_literal(pOVar16,0x51);
    Operation::add_id(pOVar16,IVar5);
    IVar5 = spv::Builder::makeFloatConstant(pBVar17,0.0,false);
    Operation::add_id(pOVar16,IVar5);
    Operation::add_id(pOVar16,pOVar15->id);
    Converter::Impl::add(pIVar21,pOVar16,false);
    IVar5 = pOVar16->id;
  }
  if (opcode != WriteSamplerFeedbackLevel) {
    uVar11 = LLVMBC::Instruction::getNumOperands(&instruction->super_Instruction);
    pVVar14 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar11 - 1);
    this_00 = LLVMBC::Internal::resolve_proxy(pVVar14);
    VVar12 = LLVMBC::Value::get_value_kind(this_00);
    if (VVar12 != Undef) {
      pOVar15 = Converter::Impl::allocate(pIVar21,OpExtInst,IVar6);
      Operation::add_id(pOVar15,pIVar21->glsl_std450_ext);
      Operation::add_literal(pOVar15,0x28);
      Operation::add_id(pOVar15,IVar5);
      IVar5 = Converter::Impl::get_id_for_value(pIVar21,pVVar14,0);
      Operation::add_id(pOVar15,IVar5);
      Converter::Impl::add(pIVar21,pOVar15,false);
      pOVar16 = Converter::Impl::allocate(pIVar21,OpExtInst,IVar6);
      Operation::add_id(pOVar16,pIVar21->glsl_std450_ext);
      Operation::add_literal(pOVar16,0x25);
      Operation::add_id(pOVar16,pOVar15->id);
      IVar5 = spv::Builder::makeFloatConstant(pBVar17,14.0,false);
      Operation::add_id(pOVar16,IVar5);
      Converter::Impl::add(pIVar21,pOVar16,false);
      IVar5 = pOVar16->id;
    }
  }
LAB_00173f10:
  pBVar17 = Converter::Impl::builder(pIVar21);
  IVar8 = spv::Builder::makeIntegerType(pBVar17,0x20,true);
  IVar9 = spv::Builder::makeFloatType(pBVar17,0x20);
  IVar10 = spv::Builder::makeBoolType(pBVar17);
  pOVar15 = Converter::Impl::allocate(pIVar21,OpConvertFToS,IVar8);
  Operation::add_id(pOVar15,IVar5);
  Converter::Impl::add(pIVar21,pOVar15,false);
  IVar6 = pOVar15->id;
  pOVar16 = Converter::Impl::allocate(pIVar21,OpFAdd,IVar9);
  Operation::add_id(pOVar16,IVar5);
  IVar5 = spv::Builder::makeFloatConstant(pBVar17,0.9970703,false);
  Operation::add_id(pOVar16,IVar5);
  Converter::Impl::add(pIVar21,pOVar16,false);
  pOVar18 = Converter::Impl::allocate(pIVar21,OpConvertFToS,IVar8);
  Operation::add_id(pOVar18,pOVar16->id);
  Converter::Impl::add(pIVar21,pOVar18,false);
  pOVar16 = Converter::Impl::allocate(pIVar21,OpExtInst,IVar8);
  Operation::add_id(pOVar16,pIVar21->glsl_std450_ext);
  Operation::add_literal(pOVar16,0x27);
  Operation::add_id(pOVar16,pOVar18->id);
  Operation::add_id(pOVar16,(Id)local_80);
  Converter::Impl::add(pIVar21,pOVar16,false);
  IVar5 = pOVar18->id;
  pOVar16 = Converter::Impl::allocate(pIVar21,OpINotEqual,IVar10);
  Operation::add_id(pOVar16,pOVar15->id);
  Operation::add_id(pOVar16,pOVar18->id);
  Converter::Impl::add(pIVar21,pOVar16,false);
  IVar8 = pOVar16->id;
  IVar9 = 0;
  if (local_94 == WriteSamplerFeedback) {
    pBVar17 = Converter::Impl::builder(pIVar21);
    IVar9 = spv::Builder::makeFloatType(pBVar17,0x20);
    IVar10 = spv::Builder::makeVectorType(pBVar17,IVar9,2);
    pOVar15 = Converter::Impl::allocate(pIVar21,OpDPdx,IVar10);
    Operation::add_id(pOVar15,IVar7);
    Converter::Impl::add(pIVar21,pOVar15,false);
    pOVar16 = Converter::Impl::allocate(pIVar21,OpDPdy,IVar10);
    Operation::add_id(pOVar16,IVar7);
    Converter::Impl::add(pIVar21,pOVar16,false);
    pOVar18 = Converter::Impl::allocate(pIVar21,OpExtInst,IVar10);
    Operation::add_id(pOVar18,pIVar21->glsl_std450_ext);
    Operation::add_literal(pOVar18,4);
    Operation::add_id(pOVar18,pOVar15->id);
    Converter::Impl::add(pIVar21,pOVar18,false);
    local_80 = (Operation *)CONCAT44(local_80._4_4_,IVar10);
    pOVar15 = Converter::Impl::allocate(pIVar21,OpExtInst,IVar10);
    Operation::add_id(pOVar15,pIVar21->glsl_std450_ext);
    Operation::add_literal(pOVar15,4);
    Operation::add_id(pOVar15,pOVar16->id);
    Converter::Impl::add(pIVar21,pOVar15,false);
    pOVar16 = Converter::Impl::allocate(pIVar21,OpCompositeExtract,IVar9);
    Operation::add_id(pOVar16,pOVar18->id);
    Operation::add_literal(pOVar16,0);
    Converter::Impl::add(pIVar21,pOVar16,false);
    pOVar19 = Converter::Impl::allocate(pIVar21,OpCompositeExtract,IVar9);
    Operation::add_id(pOVar19,pOVar15->id);
    Operation::add_literal(pOVar19,0);
    Converter::Impl::add(pIVar21,pOVar19,false);
    this_01 = Converter::Impl::allocate(pIVar21,OpCompositeExtract,IVar9);
    Operation::add_id(this_01,pOVar18->id);
    Operation::add_literal(this_01,1);
    Converter::Impl::add(pIVar21,this_01,false);
    pOVar18 = Converter::Impl::allocate(pIVar21,OpCompositeExtract,IVar9);
    Operation::add_id(pOVar18,pOVar15->id);
    Operation::add_literal(pOVar18,1);
    Converter::Impl::add(pIVar21,pOVar18,false);
    pOVar15 = Converter::Impl::allocate(pIVar21,OpExtInst,IVar9);
    Operation::add_id(pOVar15,pIVar21->glsl_std450_ext);
    Operation::add_literal(pOVar15,0x28);
    Operation::add_id(pOVar15,pOVar16->id);
    Operation::add_id(pOVar15,pOVar19->id);
    Converter::Impl::add(pIVar21,pOVar15,false);
    pOVar16 = Converter::Impl::allocate(pIVar21,OpExtInst,IVar9);
    Operation::add_id(pOVar16,pIVar21->glsl_std450_ext);
    Operation::add_literal(pOVar16,0x28);
    Operation::add_id(pOVar16,this_01->id);
    Operation::add_id(pOVar16,pOVar18->id);
    Converter::Impl::add(pIVar21,pOVar16,false);
    local_70._M_array = (iterator)CONCAT44(pOVar16->id,pOVar15->id);
    IVar9 = Converter::Impl::build_vector(pIVar21,IVar9,(Id *)&local_70,2);
    if (local_b0 != 0) {
      pOVar15 = Converter::Impl::allocate(pIVar21,OpVectorTimesScalar,(Id)local_80);
      Operation::add_id(pOVar15,IVar9);
      Operation::add_id(pOVar15,local_b0);
      Converter::Impl::add(pIVar21,pOVar15,false);
      IVar9 = pOVar15->id;
    }
  }
  local_5c = IVar9;
  pOVar15 = Converter::Impl::allocate(pIVar21,OpExtInst,IVar4);
  Operation::add_id(pOVar15,pIVar21->glsl_std450_ext);
  Operation::add_literal(pOVar15,10);
  Operation::add_id(pOVar15,IVar7);
  local_80 = pOVar15;
  Converter::Impl::add(pIVar21,pOVar15,false);
  iVar13 = 0;
  do {
    IVar4 = IVar5;
    if (iVar13 == 0) {
      IVar4 = IVar6;
    }
    bVar3 = local_98 == 3;
    pBVar17 = Converter::Impl::builder(pIVar21);
    IVar7 = spv::Builder::makeIntegerType(pBVar17,0x20,true);
    IVar7 = spv::Builder::makeVectorType(pBVar17,IVar7,2);
    IVar9 = spv::Builder::makeFloatType(pBVar17,0x20);
    IVar9 = spv::Builder::makeVectorType(pBVar17,IVar9,2);
    pOVar15 = Converter::Impl::allocate(pIVar21,OpConvertSToF,IVar9);
    type_id = local_90;
    IVar10 = emit_query_size(pIVar21,image_id,bVar3,IVar4);
    Operation::add_id(pOVar15,IVar10);
    Converter::Impl::add(pIVar21,pOVar15,false);
    pOVar16 = Converter::Impl::allocate(pIVar21,OpSNegate,IVar7);
    Operation::add_id(pOVar16,local_58);
    Converter::Impl::add(pIVar21,pOVar16,false);
    pOVar18 = Converter::Impl::allocate(pIVar21,OpExtInst,IVar9);
    Operation::add_id(pOVar18,pIVar21->glsl_std450_ext);
    Operation::add_literal(pOVar18,0x35);
    Operation::add_id(pOVar18,pOVar15->id);
    Operation::add_id(pOVar18,pOVar16->id);
    Converter::Impl::add(pIVar21,pOVar18,false);
    IVar7 = pOVar18->id;
    IVar9 = pOVar15->id;
    IVar10 = pOVar16->id;
    pOVar15 = Converter::Impl::allocate(pIVar21,OpFMul,type_id);
    Operation::add_id(pOVar15,local_80->id);
    Operation::add_id(pOVar15,IVar7);
    Converter::Impl::add(pIVar21,pOVar15,false);
    if (local_94 == WriteSamplerFeedback) {
      pOVar16 = Converter::Impl::allocate(pIVar21,OpFMul,type_id);
      Operation::add_id(pOVar16,local_5c);
      Operation::add_id(pOVar16,IVar9);
      Converter::Impl::add(pIVar21,pOVar16,false);
      pOVar18 = Converter::Impl::allocate(pIVar21,OpFSub,type_id);
      Operation::add_id(pOVar18,pOVar16->id);
      IVar7 = spv::Builder::makeFloatConstant(this,0.00390625,false);
      IVar7 = Converter::Impl::build_splat_constant_vector(pIVar21,component_00,IVar7,2);
      Operation::add_id(pOVar18,IVar7);
      Converter::Impl::add(pIVar21,pOVar18,false);
      IVar7 = local_8c;
      IVar9 = spv::Builder::makeStructResultType(this,type_id,local_8c);
      pOVar16 = Converter::Impl::allocate(pIVar21,OpExtInst,IVar9);
      Operation::add_id(pOVar16,pIVar21->glsl_std450_ext);
      Operation::add_literal(pOVar16,0x34);
      Operation::add_id(pOVar16,pOVar18->id);
      Converter::Impl::add(pIVar21,pOVar16,false);
      pOVar18 = Converter::Impl::allocate(pIVar21,OpCompositeExtract,IVar7);
      Operation::add_id(pOVar18,pOVar16->id);
      Operation::add_literal(pOVar18,1);
      Converter::Impl::add(pIVar21,pOVar18,false);
      pOVar16 = Converter::Impl::allocate(pIVar21,OpExtInst,IVar7);
      Operation::add_id(pOVar16,pIVar21->glsl_std450_ext);
      Operation::add_literal(pOVar16,0x2d);
      Operation::add_id(pOVar16,pOVar18->id);
      IVar7 = spv::Builder::makeIntegerType(this,0x20,true);
      IVar7 = spv::Builder::makeIntConstant(this,IVar7,0,false);
      uVar1 = local_84;
      IVar7 = Converter::Impl::build_splat_constant_vector(pIVar21,component,IVar7,local_84);
      Operation::add_id(pOVar16,IVar7);
      IVar7 = spv::Builder::makeIntegerType(this,0x20,true);
      IVar7 = spv::Builder::makeIntConstant(this,IVar7,4,false);
      type_id = local_90;
      IVar7 = Converter::Impl::build_splat_constant_vector(pIVar21,component,IVar7,uVar1);
      Operation::add_id(pOVar16,IVar7);
      Converter::Impl::add(pIVar21,pOVar16,false);
      pOVar18 = Converter::Impl::allocate(pIVar21,OpIAdd,local_8c);
      Operation::add_id(pOVar18,pOVar16->id);
      Operation::add_id(pOVar18,IVar10);
      Converter::Impl::add(pIVar21,pOVar18,false);
      pOVar19 = Converter::Impl::allocate(pIVar21,OpExtInst,type_id);
      Operation::add_id(pOVar19,pIVar21->glsl_std450_ext);
      Operation::add_literal(pOVar19,0x35);
      IVar7 = spv::Builder::makeFloatConstant(this,0.5,false);
      IVar7 = Converter::Impl::build_splat_constant_vector(pIVar21,component_00,IVar7,uVar1);
      Operation::add_id(pOVar19,IVar7);
      Operation::add_id(pOVar19,pOVar18->id);
      Converter::Impl::add(pIVar21,pOVar19,false);
      pOVar16 = Converter::Impl::allocate(pIVar21,OpExtInst,type_id);
      Operation::add_id(pOVar16,pIVar21->glsl_std450_ext);
      Operation::add_literal(pOVar16,0x25);
      Operation::add_id(pOVar16,pOVar19->id);
      IVar7 = spv::Builder::makeFloatConstant(this,0.5,false);
      IVar7 = Converter::Impl::build_splat_constant_vector(pIVar21,component_00,IVar7,uVar1);
      Operation::add_id(pOVar16,IVar7);
    }
    else {
      pOVar16 = Converter::Impl::allocate(pIVar21,OpExtInst,type_id);
      Operation::add_id(pOVar16,pIVar21->glsl_std450_ext);
      Operation::add_literal(pOVar16,0x35);
      IVar7 = spv::Builder::makeFloatConstant(this,0.5,false);
      IVar7 = Converter::Impl::build_splat_constant_vector(pIVar21,component_00,IVar7,local_84);
      Operation::add_id(pOVar16,IVar7);
      Operation::add_id(pOVar16,IVar10);
    }
    Converter::Impl::add(pIVar21,pOVar16,false);
    IVar7 = pOVar16->id;
    pOVar16 = Converter::Impl::allocate(pIVar21,OpFSub,type_id);
    Operation::add_id(pOVar16,pOVar15->id);
    Operation::add_id(pOVar16,IVar7);
    Converter::Impl::add(pIVar21,pOVar16,false);
    pOVar18 = Converter::Impl::allocate(pIVar21,OpExtInst,type_id);
    Operation::add_id(pOVar18,pIVar21->glsl_std450_ext);
    Operation::add_literal(pOVar18,0x28);
    Operation::add_id(pOVar18,pOVar16->id);
    IVar9 = spv::Builder::makeFloatConstant(this,0.0,false);
    IVar9 = Converter::Impl::build_splat_constant_vector(pIVar21,component_00,IVar9,local_84);
    Operation::add_id(pOVar18,IVar9);
    Converter::Impl::add(pIVar21,pOVar18,false);
    pOVar16 = Converter::Impl::allocate(pIVar21,OpFAdd,type_id);
    Operation::add_id(pOVar16,pOVar15->id);
    Operation::add_id(pOVar16,IVar7);
    Converter::Impl::add(pIVar21,pOVar16,false);
    IVar7 = local_8c;
    pOVar15 = Converter::Impl::allocate(pIVar21,OpConvertFToS,local_8c);
    Operation::add_id(pOVar15,pOVar18->id);
    Converter::Impl::add(pIVar21,pOVar15,false);
    pOVar18 = Converter::Impl::allocate(pIVar21,OpConvertFToS,IVar7);
    Operation::add_id(pOVar18,pOVar16->id);
    Converter::Impl::add(pIVar21,pOVar18,false);
    pOVar16 = Converter::Impl::allocate(pIVar21,OpINotEqual,local_54);
    pIVar22 = &pOVar15->id;
    Operation::add_id(pOVar16,pOVar15->id);
    Operation::add_id(pOVar16,pOVar18->id);
    Converter::Impl::add(pIVar21,pOVar16,false);
    IVar7 = local_88;
    pOVar15 = Converter::Impl::allocate(pIVar21,OpCompositeExtract,local_88);
    Operation::add_id(pOVar15,pOVar16->id);
    Operation::add_literal(pOVar15,0);
    Converter::Impl::add(pIVar21,pOVar15,false);
    pOVar18 = Converter::Impl::allocate(pIVar21,OpCompositeExtract,IVar7);
    Operation::add_id(pOVar18,pOVar16->id);
    Operation::add_literal(pOVar18,1);
    Converter::Impl::add(pIVar21,pOVar18,false);
    pOVar16 = Converter::Impl::allocate(pIVar21,OpLogicalAnd,IVar7);
    Operation::add_id(pOVar16,pOVar15->id);
    Operation::add_id(pOVar16,pOVar18->id);
    Converter::Impl::add(pIVar21,pOVar16,false);
    local_70._M_array = (iterator)CONCAT44(pOVar18->id,pOVar15->id);
    local_70._M_len = CONCAT44(local_70._M_len._4_4_,pOVar16->id);
    IVar7 = spv::Builder::makeIntegerType(this,0x20,true);
    IVar7 = spv::Builder::makeIntConstant(this,IVar7,1,false);
    lVar23 = 0;
    do {
      pIVar21 = local_78;
      pOVar15 = Converter::Impl::allocate(local_78,OpSelect,component);
      Operation::add_id(pOVar15,*(Id *)((long)&local_70._M_array + lVar23 * 4));
      IVar9 = spv::Builder::makeIntegerType(this,0x20,true);
      IVar9 = spv::Builder::makeIntConstant(this,IVar9,2 << ((byte)lVar23 & 0x1f),false);
      Operation::add_id(pOVar15,IVar9);
      IVar9 = spv::Builder::makeIntegerType(this,0x20,true);
      IVar9 = spv::Builder::makeIntConstant(this,IVar9,0,false);
      Operation::add_id(pOVar15,IVar9);
      Converter::Impl::add(pIVar21,pOVar15,false);
      pOVar16 = Converter::Impl::allocate(pIVar21,OpBitwiseOr,component);
      Operation::add_id(pOVar16,IVar7);
      Operation::add_id(pOVar16,pOVar15->id);
      Converter::Impl::add(pIVar21,pOVar16,false);
      IVar7 = pOVar16->id;
      lVar23 = lVar23 + 1;
    } while (lVar23 != 3);
    IVar9 = spv::Builder::makeIntegerType(this,0x40,false);
    pIVar21 = local_78;
    pOVar15 = Converter::Impl::allocate(local_78,OpSConvert,IVar9);
    Operation::add_id(pOVar15,IVar7);
    Converter::Impl::add(pIVar21,pOVar15,false);
    pOVar16 = Converter::Impl::allocate(pIVar21,OpIMul,component);
    Operation::add_id(pOVar16,IVar4);
    IVar4 = spv::Builder::makeIntegerType(this,0x20,true);
    IVar4 = spv::Builder::makeIntConstant(this,IVar4,4,false);
    Operation::add_id(pOVar16,IVar4);
    Converter::Impl::add(pIVar21,pOVar16,false);
    pOVar18 = Converter::Impl::allocate(pIVar21,OpSConvert,IVar9);
    Operation::add_id(pOVar18,pOVar16->id);
    Converter::Impl::add(pIVar21,pOVar18,false);
    pOVar16 = Converter::Impl::allocate(pIVar21,OpShiftLeftLogical,IVar9);
    Operation::add_id(pOVar16,pOVar15->id);
    Operation::add_id(pOVar16,pOVar18->id);
    Converter::Impl::add(pIVar21,pOVar16,false);
    IVar4 = local_50;
    pIVar21 = local_78;
    if (local_50 != 0) {
      IVar7 = spv::Builder::makeVectorType(this,component,local_98);
      pIVar21 = local_78;
      pOVar15 = Converter::Impl::allocate(local_78,OpCompositeConstruct,IVar7);
      Operation::add_id(pOVar15,*pIVar22);
      Operation::add_id(pOVar15,IVar4);
      Converter::Impl::add(pIVar21,pOVar15,false);
      pIVar22 = &pOVar15->id;
    }
    IVar7 = local_88;
    IVar4 = *pIVar22;
    if (pIVar21->execution_model == ExecutionModelFragment) {
      pOVar15 = Converter::Impl::allocate(pIVar21,OpIsHelperInvocationEXT,local_88);
      Converter::Impl::add(pIVar21,pOVar15,false);
      pOVar18 = Converter::Impl::allocate(pIVar21,OpLogicalNot,IVar7);
      Operation::add_id(pOVar18,pOVar15->id);
      Converter::Impl::add(pIVar21,pOVar18,false);
      IVar9 = pOVar18->id;
      if (iVar13 != 0) {
        pOVar15 = Converter::Impl::allocate(pIVar21,OpLogicalAnd,IVar7);
        Operation::add_id(pOVar15,IVar9);
        Operation::add_id(pOVar15,IVar8);
        Converter::Impl::add(pIVar21,pOVar15,false);
        IVar9 = pOVar15->id;
      }
    }
    else {
      IVar9 = IVar8;
      if (iVar13 == 0) {
        IVar9 = spv::Builder::makeBoolConstant(this,true,false);
      }
    }
    pmVar2 = local_40;
    IVar7 = SPIRVModule::get_helper_call_id
                      (pIVar21->spirv_module,
                       (uint)(local_98 == 3) + (local_40->non_uniform & 1) * 2 +
                       AtomicImageR64Compact,0);
    IVar10 = spv::Builder::makeVoidType(this);
    pOVar15 = Converter::Impl::allocate(pIVar21,OpFunctionCall,IVar10);
    Operation::add_id(pOVar15,IVar7);
    Operation::add_id(pOVar15,pmVar2->var_id);
    Operation::add_id(pOVar15,IVar4);
    Operation::add_id(pOVar15,pOVar16->id);
    Operation::add_id(pOVar15,IVar9);
    Converter::Impl::add(pIVar21,pOVar15,false);
    bVar3 = iVar13 == 0;
    iVar13 = iVar13 + 1;
  } while (bVar3);
  return bVar20;
}

Assistant:

bool emit_write_sampler_feedback_instruction(DXIL::Op opcode, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	builder.addCapability(spv::CapabilityImageQuery);
	if (!impl.glsl_std450_ext)
		impl.glsl_std450_ext = builder.import("GLSL.std.450");

	spv::Id feedback_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(2));
	spv::Id sampler_id = impl.get_id_for_value(instruction->getOperand(3));
	const auto &meta = impl.handle_to_resource_meta[feedback_id];

	uint32_t num_coords_full = 0, num_coords = 0;
	if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
		return false;

	// Should not happen.
	if (num_coords != 2)
		return false;

	spv::Id bool_type = builder.makeBoolType();
	spv::Id i32_type = builder.makeIntType(32);
	spv::Id f32_type = builder.makeFloatType(32);
	spv::Id bvec_type = builder.makeVectorType(bool_type, 2);
	spv::Id ivec_type = builder.makeVectorType(i32_type, 2);
	spv::Id fvec_type = builder.makeVectorType(f32_type, 2);

	spv::Id int_layer_id = 0;
	if (num_coords_full == 3)
	{
		// Vulkan allows for two implementation of this rounding, either RTE or floor(v + 0.5).
		// Pick the suggested one. This matches real-world implementations.
		auto *rounded_layer = impl.allocate(spv::OpExtInst, f32_type);
		rounded_layer->add_id(impl.glsl_std450_ext);
		rounded_layer->add_literal(GLSLstd450RoundEven);
		rounded_layer->add_id(impl.get_id_for_value(instruction->getOperand(6)));
		impl.add(rounded_layer);

		auto *int_layer = impl.allocate(spv::OpConvertFToS, i32_type);
		int_layer->add_id(rounded_layer->id);
		impl.add(int_layer);

		int_layer_id = int_layer->id;
	}

	spv::Id coord_ids[2];
	for (uint32_t i = 0; i < 2; i++)
		coord_ids[i] = impl.get_id_for_value(instruction->getOperand(4 + i));
	spv::Id coord_id = impl.build_vector(f32_type, coord_ids, 2);
	spv::Id mip_region_size_log2 = emit_mip_region_size_log2(impl, instruction, feedback_id, num_coords_full == 3);
	spv::Id max_level_id = emit_max_level(impl, image_id);

	// This part will change quite dramatically based on op-code.
	// Computing the actual LOD to access is quite painful.
	// We cannot do it properly for most interesting cases without having side band information
	// about sampler state. In real-world scenarios, applications will likely adhere to whatever mip level
	// we decide to access either way, so it shouldn't lead to serious problems.
	spv::Id grad_scale_id;
	spv::Id access_lod_id = emit_accessed_lod(opcode, impl, instruction, image_id, sampler_id, coord_id,
	                                          max_level_id, &grad_scale_id, num_coords_full == 3);

	auto lods = emit_trilinear_lods(impl, access_lod_id, max_level_id);

	spv::Id normalized_grad_extent = 0;
	if (opcode == DXIL::Op::WriteSamplerFeedback || opcode == DXIL::Op::WriteSamplerFeedbackBias)
		normalized_grad_extent = emit_gradient_extent_normalized(impl, coord_id, grad_scale_id);

	// Assume that if we get coordinates above 1.0 we intend to WRAP.
	// Only WRAP and CLAMP is supported with sampler feedback (but WRAP is kinda broken on NV hardware).
	// After wrap, assume CLAMP semantics for purposes of filtering.
	auto *fract_uv_op = impl.allocate(spv::OpExtInst, fvec_type);
	fract_uv_op->add_id(impl.glsl_std450_ext);
	fract_uv_op->add_literal(GLSLstd450Fract);
	fract_uv_op->add_id(coord_id);
	impl.add(fract_uv_op);

	for (unsigned lod_iteration = 0; lod_iteration < 2; lod_iteration++)
	{
		spv::Id lod_id = lod_iteration ? lods.coarse_lod_id : lods.fine_lod_id;

		auto scaling = emit_scaling_factor_to_mip_region_space(
			impl, instruction, image_id, lod_id,
			mip_region_size_log2, num_coords_full == 3);

		auto *mul_mip_region_coord = impl.allocate(spv::OpFMul, fvec_type);
		mul_mip_region_coord->add_id(fract_uv_op->id);
		mul_mip_region_coord->add_id(scaling.normalized_scale_id);
		impl.add(mul_mip_region_coord);

		// We have to assume the worst w.r.t. filtering / aniso.
		// Simplify this with a ton with crude, but effective approximations.
		// Compute derivatives in mip region space.
		// Based on these derivatives, we get a bounding box.
		// The size of this bounding box is then clamped to a minimum and maximum size.
		// At minimum, we have 1x aniso / bilinear. Extent is +/- 0.5 texels.
		// At maximum, we have 16x aniso. Extent is +/- 8 texels.
		// Need to look at derivatives so that we can compute conservative aniso extent.

		// For implicit LOD, we compute the gradient and try to recover aniso information.
		spv::Id clamped_extent_id;

		if (opcode == DXIL::Op::WriteSamplerFeedback || opcode == DXIL::Op::WriteSamplerFeedbackBias)
		{
			auto *scale_size = impl.allocate(spv::OpFMul, fvec_type);
			scale_size->add_id(normalized_grad_extent);
			scale_size->add_id(scaling.float_size_id);
			impl.add(scale_size);

			// For integer LODs, we will end up computing an approximate integer due to FP derivatives.
			// It would be very bad if we got a positive error and rounded up a full POT.
			// LODs tend to be snapped to fixed point, so use a sufficient threshold to avoid these errors.
			// This value is chosen somewhat arbitrarily, but one subtexel worth of bias seems reasonable.
			auto *rounding_bias = impl.allocate(spv::OpFSub, fvec_type);
			rounding_bias->add_id(scale_size->id);
			rounding_bias->add_id(
				impl.build_splat_constant_vector(f32_type, builder.makeFloatConstant(1.0f / 256.0f), 2));
			impl.add(rounding_bias);

			// With aniso factors, implementations are allowed to round up the aniso factor
			// to nearest supported value.
			// From exhaustive testing, NV and Intel have somewhat different behavior, but in general,
			// all POT factors behave accurately with this implementation.
			// Oddly enough, the extent is enlongated as well when rounding up, which is also not spec compliant ...
			// What we want to do is round up to next POT and round up extent similarly,
			// and the cutest way to do this is with frexp. The exponent represents next POT in magnitude.
			// We can then clamp that frexp to [unormalized_exponent_id, unnormalized_exponent_id + 4].
			// We're robust against NaN since the exponent is undefined, but we'll clamp that below in integer space.
			auto *frexp = impl.allocate(spv::OpExtInst, builder.makeStructResultType(fvec_type, ivec_type));
			frexp->add_id(impl.glsl_std450_ext);
			frexp->add_literal(GLSLstd450FrexpStruct);
			frexp->add_id(rounding_bias->id);
			impl.add(frexp);

			auto *extract = impl.allocate(spv::OpCompositeExtract, ivec_type);
			extract->add_id(frexp->id);
			extract->add_literal(1);
			impl.add(extract);

			auto *sclamp = impl.allocate(spv::OpExtInst, ivec_type);
			sclamp->add_id(impl.glsl_std450_ext);
			sclamp->add_literal(GLSLstd450SClamp);
			sclamp->add_id(extract->id);
			sclamp->add_id(impl.build_splat_constant_vector(i32_type, builder.makeIntConstant(0), num_coords));
			sclamp->add_id(impl.build_splat_constant_vector(i32_type, builder.makeIntConstant(4), num_coords));
			impl.add(sclamp);

			auto *shift_exp = impl.allocate(spv::OpIAdd, ivec_type);
			shift_exp->add_id(sclamp->id);
			shift_exp->add_id(scaling.unnormalized_exponent_id);
			impl.add(shift_exp);

			// For aniso, the conservative filter extent is half the major length.
			// Halve the bounding box extents as a rough approximation.
			// For bilinear, the footprint can be found in [-0.5, 0.5] texels.
			// Fuse the multiply and exp2() here in ldexp.
			auto *fextent = impl.allocate(spv::OpExtInst, fvec_type);
			fextent->add_id(impl.glsl_std450_ext);
			fextent->add_literal(GLSLstd450Ldexp);
			fextent->add_id(impl.build_splat_constant_vector(f32_type, builder.makeFloatConstant(0.5f), num_coords));
			fextent->add_id(shift_exp->id);
			impl.add(fextent);

			// We only support signalling access for nearest neighbor.
			// For 16x aniso with 4x4 region, this can go wrong, but we don't really care.
			// Worst case, we can clamp to 16x16 region internally and upsample the region map on resolve.
			// Maximum +/- 0.5 regions is allowed here, this ensures that we access maximum 2x2 blocks.
			auto *clamped_extent = impl.allocate(spv::OpExtInst, fvec_type);
			clamped_extent->add_id(impl.glsl_std450_ext);
			clamped_extent->add_literal(GLSLstd450FMin);
			clamped_extent->add_id(fextent->id);
			clamped_extent->add_id(
				impl.build_splat_constant_vector(f32_type, builder.makeFloatConstant(0.5f), num_coords));
			impl.add(clamped_extent);

			clamped_extent_id = clamped_extent->id;
		}
		else
		{
			// Level is incompatible with aniso, so always assume simple bilinear. Use fixed +/- 0.5 pixel footprint.
			// For explicit gradient, we also assume no aniso,
			// since computing aniso-factors can cause far too fine mips to be requested if this was not intended by app.
			// We have no good way to detect this, and trying to compute aniso factors
			// accurately to hardware is a losing game since every implementation applies heavy approximations.
			auto *min_extent = impl.allocate(spv::OpExtInst, fvec_type);
			min_extent->add_id(impl.glsl_std450_ext);
			min_extent->add_literal(GLSLstd450Ldexp);
			min_extent->add_id(impl.build_splat_constant_vector(f32_type, builder.makeFloatConstant(0.5f), num_coords));
			min_extent->add_id(scaling.unnormalized_exponent_id);
			impl.add(min_extent);

			clamped_extent_id = min_extent->id;
		}

		auto *lo_foot_print = impl.allocate(spv::OpFSub, fvec_type);
		lo_foot_print->add_id(mul_mip_region_coord->id);
		lo_foot_print->add_id(clamped_extent_id);
		impl.add(lo_foot_print);

		auto *lo_clamped = impl.allocate(spv::OpExtInst, fvec_type);
		lo_clamped->add_id(impl.glsl_std450_ext);
		lo_clamped->add_literal(GLSLstd450FMax);
		lo_clamped->add_id(lo_foot_print->id);
		lo_clamped->add_id(impl.build_splat_constant_vector(f32_type, builder.makeFloatConstant(0.0f), num_coords));
		impl.add(lo_clamped);

		auto *hi_foot_print = impl.allocate(spv::OpFAdd, fvec_type);
		hi_foot_print->add_id(mul_mip_region_coord->id);
		hi_foot_print->add_id(clamped_extent_id);
		impl.add(hi_foot_print);

		auto *lo_int = impl.allocate(spv::OpConvertFToS, ivec_type);
		lo_int->add_id(lo_clamped->id);
		impl.add(lo_int);

		auto *hi_int = impl.allocate(spv::OpConvertFToS, ivec_type);
		hi_int->add_id(hi_foot_print->id);
		impl.add(hi_int);

		auto *not_equal = impl.allocate(spv::OpINotEqual, bvec_type);
		not_equal->add_id(lo_int->id);
		not_equal->add_id(hi_int->id);
		impl.add(not_equal);

		auto *visit_horiz = impl.allocate(spv::OpCompositeExtract, bool_type);
		visit_horiz->add_id(not_equal->id);
		visit_horiz->add_literal(0);
		impl.add(visit_horiz);

		auto *visit_vert = impl.allocate(spv::OpCompositeExtract, bool_type);
		visit_vert->add_id(not_equal->id);
		visit_vert->add_literal(1);
		impl.add(visit_vert);

		auto *visit_diag = impl.allocate(spv::OpLogicalAnd, bool_type);
		visit_diag->add_id(visit_horiz->id);
		visit_diag->add_id(visit_vert->id);
		impl.add(visit_diag);

		const spv::Id bit_ids[3] = {visit_horiz->id, visit_vert->id, visit_diag->id};
		spv::Id merged_bit = builder.makeIntConstant(1);

		for (unsigned i = 0; i < 3; i++)
		{
			auto *select_op = impl.allocate(spv::OpSelect, i32_type);
			select_op->add_id(bit_ids[i]);
			select_op->add_id(builder.makeIntConstant(2 << i));
			select_op->add_id(builder.makeIntConstant(0));
			impl.add(select_op);

			auto *or_op = impl.allocate(spv::OpBitwiseOr, i32_type);
			or_op->add_id(merged_bit);
			or_op->add_id(select_op->id);
			impl.add(or_op);

			merged_bit = or_op->id;
		}

		spv::Id u64_type = builder.makeUintType(64);
		auto *u64_conv = impl.allocate(spv::OpSConvert, u64_type);
		u64_conv->add_id(merged_bit);
		impl.add(u64_conv);

		auto *shamt = impl.allocate(spv::OpIMul, i32_type);
		shamt->add_id(lod_id);
		shamt->add_id(builder.makeIntConstant(4));
		impl.add(shamt);

		auto *shamt64 = impl.allocate(spv::OpSConvert, u64_type);
		shamt64->add_id(shamt->id);
		impl.add(shamt64);

		auto *shift_op = impl.allocate(spv::OpShiftLeftLogical, u64_type);
		shift_op->add_id(u64_conv->id);
		shift_op->add_id(shamt64->id);
		impl.add(shift_op);

		spv::Id comp_id;
		if (int_layer_id)
		{
			auto *comp = impl.allocate(spv::OpCompositeConstruct, builder.makeVectorType(i32_type, num_coords_full));
			comp->add_id(lo_int->id);
			comp->add_id(int_layer_id);
			impl.add(comp);
			comp_id = comp->id;
		}
		else
		{
			comp_id = lo_int->id;
		}

		spv::Id participate_id;
		if (impl.execution_model == spv::ExecutionModelFragment)
		{
			auto *is_helper = impl.allocate(spv::OpIsHelperInvocationEXT, bool_type);
			impl.add(is_helper);

			auto *not_op = impl.allocate(spv::OpLogicalNot, bool_type);
			not_op->add_id(is_helper->id);
			impl.add(not_op);

			participate_id = not_op->id;

			if (lod_iteration != 0)
			{
				auto *trilinear_and = impl.allocate(spv::OpLogicalAnd, bool_type);
				trilinear_and->add_id(participate_id);
				trilinear_and->add_id(lods.trilinear_enable_id);
				impl.add(trilinear_and);
				participate_id = trilinear_and->id;
			}
		}
		else
		{
			if (lod_iteration == 0)
				participate_id = builder.makeBoolConstant(true);
			else
				participate_id = lods.trilinear_enable_id;
		}

		HelperCall helper_call;
		if (num_coords_full == 3 && meta.non_uniform)
			helper_call = HelperCall::AtomicImageArrayR64CompactNonUniform;
		else if (num_coords_full == 3)
			helper_call = HelperCall::AtomicImageArrayR64Compact;
		else if (meta.non_uniform)
			helper_call = HelperCall::AtomicImageR64CompactNonUniform;
		else
			helper_call = HelperCall::AtomicImageR64Compact;

		spv::Id call_id = impl.spirv_module.get_helper_call_id(helper_call);
		auto *call = impl.allocate(spv::OpFunctionCall, builder.makeVoidType());
		call->add_id(call_id);
		call->add_id(meta.var_id);
		call->add_id(comp_id);
		call->add_id(shift_op->id);
		call->add_id(participate_id);
		impl.add(call);
	}

	return true;
}